

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsItem::ensureVisible(QGraphicsItem *this,QRectF *rect,int xmargin,int ymargin)

{
  bool bVar1;
  QGraphicsItemPrivate *pQVar2;
  const_iterator o;
  QRectF *in_RSI;
  QGraphicsItem *in_RDI;
  long in_FS_OFFSET;
  QGraphicsView *view;
  add_const_t<QList<QGraphicsView_*>_> *__range2;
  const_iterator __end2;
  const_iterator __begin2;
  QRectF sceneRect;
  QGraphicsItem *in_stack_ffffffffffffff10;
  QGraphicsItem *this_00;
  const_iterator local_c0;
  QGraphicsView *local_b8;
  qreal local_b0;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  QRectF *in_stack_ffffffffffffff60;
  QGraphicsView *in_stack_ffffffffffffff68;
  qreal local_90;
  QRectF local_78 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->(&in_RDI->d_ptr);
  if (pQVar2->scene != (QGraphicsScene *)0x0) {
    local_78[0].xp = -NAN;
    local_78[0].yp = -NAN;
    local_78[0].w = -NAN;
    local_78[0].h = -NAN;
    QRectF::QRectF(local_78);
    bVar1 = QRectF::isNull(in_RSI);
    if (bVar1) {
      sceneBoundingRect(this_00);
      local_78[0].xp = (qreal)local_b8;
      local_78[0].yp = local_b0;
    }
    else {
      sceneTransform(in_stack_ffffffffffffff10);
      QTransform::mapRect((QRectF *)&stack0xffffffffffffff68);
      local_78[0].yp = local_90;
      local_78[0].xp = (qreal)in_stack_ffffffffffffff68;
    }
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              (&in_RDI->d_ptr);
    QGraphicsScene::d_func((QGraphicsScene *)0x97df27);
    local_c0.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
    local_c0 = QList<QGraphicsView_*>::begin((QList<QGraphicsView_*> *)in_RDI);
    o = QList<QGraphicsView_*>::end((QList<QGraphicsView_*> *)in_RDI);
    while (bVar1 = QList<QGraphicsView_*>::const_iterator::operator!=(&local_c0,o), bVar1) {
      QList<QGraphicsView_*>::const_iterator::operator*(&local_c0);
      QGraphicsView::ensureVisible
                (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                 in_stack_ffffffffffffff58);
      QList<QGraphicsView_*>::const_iterator::operator++(&local_c0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItem::ensureVisible(const QRectF &rect, int xmargin, int ymargin)
{
    if (d_ptr->scene) {
        QRectF sceneRect;
        if (!rect.isNull())
            sceneRect = sceneTransform().mapRect(rect);
        else
            sceneRect = sceneBoundingRect();
        for (QGraphicsView *view : std::as_const(d_ptr->scene->d_func()->views))
            view->ensureVisible(sceneRect, xmargin, ymargin);
    }
}